

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O1

void ScaleRowUp2_16_C(uint16_t *src_ptr,ptrdiff_t src_stride,uint16_t *dst,int dst_width)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  
  if (1 < dst_width) {
    iVar5 = 0;
    do {
      uVar1 = *src_ptr;
      uVar2 = src_ptr[1];
      uVar3 = src_ptr[src_stride];
      uVar4 = src_ptr[src_stride + 1];
      src_ptr = src_ptr + 1;
      *dst = (uint16_t)
             ((uint)uVar1 + (uint)uVar1 * 8 + (uint)uVar4 + ((uint)uVar3 + (uint)uVar2) * 3 + 8 >> 4
             );
      dst[1] = (uint16_t)
               (((uint)uVar4 + (uint)uVar1) * 3 + (uint)uVar2 + (uint)uVar2 * 8 + (uint)uVar3 + 8 >>
               4);
      dst = dst + 2;
      iVar5 = iVar5 + 2;
    } while (iVar5 < dst_width + -1);
  }
  if ((dst_width & 1U) != 0) {
    *dst = (uint16_t)
           (((uint)src_ptr[src_stride] + (uint)src_ptr[1]) * 3 +
            (uint)*src_ptr + (uint)*src_ptr * 8 + (uint)(src_ptr + src_stride)[1] + 8 >> 4);
  }
  return;
}

Assistant:

void ScaleRowUp2_16_C(const uint16_t* src_ptr,
                      ptrdiff_t src_stride,
                      uint16_t* dst,
                      int dst_width) {
  const uint16_t* src2 = src_ptr + src_stride;

  int x;
  for (x = 0; x < dst_width - 1; x += 2) {
    uint16_t p0 = src_ptr[0];
    uint16_t p1 = src_ptr[1];
    uint16_t p2 = src2[0];
    uint16_t p3 = src2[1];
    dst[0] = (p0 * 9 + p1 * 3 + p2 * 3 + p3 + 8) >> 4;
    dst[1] = (p0 * 3 + p1 * 9 + p2 + p3 * 3 + 8) >> 4;
    ++src_ptr;
    ++src2;
    dst += 2;
  }
  if (dst_width & 1) {
    uint16_t p0 = src_ptr[0];
    uint16_t p1 = src_ptr[1];
    uint16_t p2 = src2[0];
    uint16_t p3 = src2[1];
    dst[0] = (p0 * 9 + p1 * 3 + p2 * 3 + p3 + 8) >> 4;
  }
}